

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCas.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCascade(Abc_Ntk_t *pNtk,int nLutSize,int fCheck,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  void *pvVar6;
  DdManager *pDVar7;
  abctime aVar8;
  DdNode **pOutputs;
  undefined8 *puVar9;
  int *piVar10;
  undefined8 uVar11;
  DdNode *pDVar12;
  char *pFileGeneric;
  Abc_Ntk_t *pNtk_00;
  ulong uVar13;
  long lVar14;
  int iVar15;
  Vec_Ptr_t *p;
  long lVar16;
  
  aVar5 = Abc_Clock();
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCas.c"
                  ,0x47,"Abc_Ntk_t *Abc_NtkCascade(Abc_Ntk_t *, int, int, int)");
  }
  pNtk_00 = (Abc_Ntk_t *)0x0;
  pvVar6 = Abc_NtkBuildGlobalBdds(pNtk,500000,1,1,0,fVerbose);
  if (pvVar6 != (void *)0x0) {
    if (fVerbose != 0) {
      pDVar7 = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
      uVar2 = Cudd_ReadKeys(pDVar7);
      uVar3 = Cudd_ReadDead(pDVar7);
      iVar4 = 0x7a95fc;
      printf("Shared BDD size = %6d nodes.  ",(ulong)(uVar2 - uVar3));
      Abc_Print(iVar4,"%s =","BDD construction time");
      aVar8 = Abc_Clock();
      Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar8 - aVar5) / 1000000.0);
    }
    pDVar7 = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
    p = pNtk->vCos;
    uVar13 = (ulong)p->nSize;
    pOutputs = (DdNode **)malloc(uVar13 << 3);
    for (lVar16 = 0; lVar16 < (int)uVar13; lVar16 = lVar16 + 1) {
      puVar9 = (undefined8 *)Vec_PtrEntry(p,(int)lVar16);
      piVar10 = (int *)Abc_NtkGlobalBdd((Abc_Ntk_t *)*puVar9);
      pvVar6 = *(void **)(piVar10 + 2);
      if (pvVar6 == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar4 = *(int *)(puVar9 + 2);
      lVar14 = (long)iVar4;
      iVar1 = *piVar10;
      if (iVar1 <= iVar4) {
        iVar15 = iVar4 + 10;
        if (iVar4 < iVar1 * 2) {
          iVar15 = iVar1 * 2;
        }
        if (iVar1 < iVar15) {
          pvVar6 = realloc(pvVar6,(long)iVar15 * 8);
          *(void **)(piVar10 + 2) = pvVar6;
          memset((void *)((long)*piVar10 * 8 + (long)pvVar6),0,((long)iVar15 - (long)*piVar10) * 8);
          *piVar10 = iVar15;
        }
      }
      pDVar12 = *(DdNode **)((long)pvVar6 + lVar14 * 8);
      if (pDVar12 == (DdNode *)0x0) {
        if (*(code **)(piVar10 + 8) == (code *)0x0) {
          pDVar12 = (DdNode *)0x0;
        }
        else {
          uVar11 = (**(code **)(piVar10 + 8))(*(undefined8 *)(piVar10 + 4));
          *(undefined8 *)(*(long *)(piVar10 + 2) + lVar14 * 8) = uVar11;
          pDVar12 = *(DdNode **)(*(long *)(piVar10 + 2) + lVar14 * 8);
        }
      }
      pOutputs[lVar16] = pDVar12;
      p = pNtk->vCos;
      uVar13 = (ulong)(uint)p->nSize;
    }
    pFileGeneric = Extra_FileNameGeneric(pNtk->pSpec);
    Abc_CascadeExperiment
              (pFileGeneric,pDVar7,pOutputs,pNtk->vCis->nSize,pNtk->vCos->nSize,nLutSize,fCheck,
               fVerbose);
    pNtk_00 = Abc_NtkDup(pNtk);
    Abc_NtkFreeGlobalBdds(pNtk,1);
    free(pOutputs);
    free(pFileGeneric);
    iVar4 = Abc_NtkCheck(pNtk_00);
    if (iVar4 == 0) {
      puts("Abc_NtkCollapse: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkCascade( Abc_Ntk_t * pNtk, int nLutSize, int fCheck, int fVerbose )
{
    DdManager * dd;
    DdNode ** ppOutputs;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode;
    char * pFileGeneric;
    int fBddSizeMax = 500000;
    int i, fReorder = 1;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, fBddSizeMax, 1, fReorder, 0, fVerbose) == NULL )
        return NULL;

    if ( fVerbose )
    {
        DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
        printf( "Shared BDD size = %6d nodes.  ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
        ABC_PRT( "BDD construction time", Abc_Clock() - clk );
    }

    // collect global BDDs
    dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
    ppOutputs = ABC_ALLOC( DdNode *, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        ppOutputs[i] = (DdNode *)Abc_ObjGlobalBdd(pNode);

    // call the decomposition
    pFileGeneric = Extra_FileNameGeneric( pNtk->pSpec );
    if ( !Abc_CascadeExperiment( pFileGeneric, dd, ppOutputs, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), nLutSize, fCheck, fVerbose ) )
    {
        // the LUT size is too small
    }

    // for now, duplicate the network
    pNtkNew = Abc_NtkDup( pNtk );

    // cleanup
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    ABC_FREE( ppOutputs );
    ABC_FREE( pFileGeneric );

//    if ( pNtk->pExdc )
//        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCollapse: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}